

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

ostream * operator<<(ostream *s,Matrix *m)

{
  Matrix *s_00;
  void *this;
  ostream *poVar1;
  Matrix local_120;
  uint local_20;
  int local_1c;
  int i_1;
  int i;
  Matrix *m_local;
  ostream *s_local;
  
  _i_1 = m;
  m_local = (Matrix *)s;
  if (m->nMatrixDimension == 0) {
    this = (void *)std::ostream::operator<<(s,*m->pData);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else if (m->nMatrixDimension == 1) {
    for (local_1c = 0; local_1c < *_i_1->pSize; local_1c = local_1c + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(m_local,_i_1->pData[local_1c]);
      std::operator<<(poVar1,' ');
    }
    std::ostream::operator<<(m_local,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (local_20 = 0; s_00 = m_local, (int)local_20 < *_i_1->pSize; local_20 = local_20 + 1) {
      Matrix::read(&local_120,(int)_i_1,(void *)(ulong)local_20,(size_t)_i_1->pSize);
      operator<<((ostream *)s_00,&local_120);
      Matrix::~Matrix(&local_120);
    }
    std::ostream::operator<<(m_local,std::endl<char,std::char_traits<char>>);
  }
  return (ostream *)m_local;
}

Assistant:

ostream& operator<<(ostream& s, const Matrix& m)
{	
	switch( m.nMatrixDimension ) {
	case 0:
		s  << m.pData[0] << endl;
		break;
	case 1:
		for( int i=0; i<m.pSize[0]; i++ )
			s << m.pData[i] << ' ';
		s << endl;
		break;
	default:
		// start recursion
		for(int i=0; i<m.pSize[0]; i++) 
			s << m.read(i);
		s << endl;			
		break;
	}
	return s;
}